

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

int unmatched_inclusions_warn(archive *matching,char *msg)

{
  wchar_t wVar1;
  char *in_RAX;
  int *piVar2;
  char *p;
  char *local_28;
  
  local_28 = in_RAX;
  if (matching == (archive *)0x0) {
    wVar1 = L'\0';
  }
  else {
    while (wVar1 = archive_match_path_unmatched_inclusions_next(matching,&local_28), wVar1 == L'\0')
    {
      lafe_warnc(0,"%s: %s",local_28,"Not found in archive");
    }
    if (wVar1 == L'\xffffffe2') {
      piVar2 = __errno_location();
      lafe_errc(1,*piVar2,"Out of memory");
    }
    wVar1 = archive_match_path_unmatched_inclusions(matching);
  }
  return wVar1;
}

Assistant:

static int
unmatched_inclusions_warn(struct archive *matching, const char *msg)
{
	const char *p;
	int r;

	if (matching == NULL)
		return (0);

	while ((r = archive_match_path_unmatched_inclusions_next(
	    matching, &p)) == ARCHIVE_OK)
		lafe_warnc(0, "%s: %s", p, msg);
	if (r == ARCHIVE_FATAL)
		lafe_errc(1, errno, "Out of memory");

	return (archive_match_path_unmatched_inclusions(matching));
}